

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

void __thiscall CTPNStmTry::gen_jsr_finally(CTPNStmTry *this)

{
  CTcGenTarg *pCVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->finally_lbl_ != (CTcCodeLabel *)0x0) {
    CTcGenTarg::write_op(G_cg,0x9c);
    CTcCodeStream::write_ofs(G_cs,this->finally_lbl_,0,0);
    pCVar1 = G_cg;
    iVar2 = G_cg->sp_depth_;
    if (G_cg->max_sp_depth_ <= iVar2) {
      G_cg->max_sp_depth_ = iVar2 + 1;
    }
    pCVar1->sp_depth_ = iVar2;
    iVar2 = (*(((this->super_CTPNStmTryBase).finally_stm_)->super_CTPNStmFinallyBase).
              super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.
              super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1a])();
    iVar3 = (*(((this->super_CTPNStmTryBase).finally_stm_)->super_CTPNStmFinallyBase).
              super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.
              super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1b])();
    CTPNStmBase::add_debug_line_rec
              ((CTPNStmBase *)this,(CTcTokFileDesc *)CONCAT44(extraout_var,iVar2),
               CONCAT44(extraout_var_00,iVar3));
    return;
  }
  return;
}

Assistant:

void CTPNStmTry::gen_jsr_finally()
{
    /* if we have a 'finally', call it */
    if (finally_lbl_ != 0)
    {
        /* generate the local subroutine call */
        G_cg->write_op(OPC_LJSR);
        G_cs->write_ofs2(finally_lbl_, 0);

        /* 
         *   the LJSR pushes a value, which is then immediately popped (we
         *   must note the push and pop because it affects our maximum
         *   stack depth requirement) 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /* 
         *   whatever follows the LJSR is logically at the end of the
         *   'finally' block 
         */
        add_debug_line_rec(finally_stm_->get_end_desc(),
                           finally_stm_->get_end_linenum());
    }
}